

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall NNTreeIterator::increment(NNTreeIterator *this,bool backward)

{
  QPDF *pQVar1;
  NNTreeDetails *pNVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  QPDFObjectHandle QVar7;
  bool local_169;
  byte local_149;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  QPDFObjectHandle local_d8;
  allocator<char> local_c1;
  string local_c0;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  undefined1 local_80 [8];
  QPDFObjectHandle pe_node;
  value_type *element;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  byte local_49;
  undefined1 local_48 [7];
  bool found;
  QPDFObjectHandle items;
  bool found_valid_key;
  QPDFObjectHandle local_28;
  byte local_11;
  NNTreeIterator *pNStack_10;
  bool backward_local;
  NNTreeIterator *this_local;
  
  local_11 = backward;
  pNStack_10 = this;
  if (this->item_number < 0) {
    QTC::TC("qpdf","NNTree increment end()",0);
    QPDFObjectHandle::QPDFObjectHandle(&local_28,&this->impl->oh);
    deepen(this,&local_28,(bool)(~local_11 & 1),true);
    QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  }
  else {
    items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    while( true ) {
      bVar3 = valid(this);
      local_149 = 0;
      if (bVar3) {
        local_149 = items.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                    _3_1_ ^ 0xff;
      }
      if ((local_149 & 1) == 0) break;
      iVar6 = 2;
      if ((local_11 & 1) != 0) {
        iVar6 = -2;
      }
      this->item_number = iVar6 + this->item_number;
      (*(code *)**(undefined8 **)this->impl->details)();
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_48,(string *)&this->node);
      if ((this->item_number < 0) ||
         (iVar6 = this->item_number,
         iVar5 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_48), iVar5 <= iVar6)) {
        local_49 = 0;
        element = (value_type *)0x0;
        _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&element);
        setItemNumber(this,(QPDFObjectHandle *)&element,-1);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&element);
        while( true ) {
          local_169 = true;
          if ((local_49 & 1) == 0) {
            local_169 = std::__cxx11::
                        list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                        ::empty(&this->path);
          }
          if (((local_169 ^ 0xffU) & 1) == 0) break;
          pe_node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::__cxx11::
               list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::back
                         (&this->path);
          getNextKid((NNTreeIterator *)local_80,(PathElement *)this,
                     SUB81(pe_node.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0));
          bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_80);
          if (bVar3) {
            std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
            pop_back(&this->path);
          }
          else {
            QPDFObjectHandle::QPDFObjectHandle(&local_90,(QPDFObjectHandle *)local_80);
            local_49 = deepen(this,&local_90,(bool)(~local_11 & 1),false);
            QPDFObjectHandle::~QPDFObjectHandle(&local_90);
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
        }
      }
      if (-1 < this->item_number) {
        (*(code *)**(undefined8 **)this->impl->details)();
        QPDFObjectHandle::getKey(&local_a0,(string *)&this->node);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_48,&local_a0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
        iVar6 = this->item_number;
        iVar5 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_48);
        if (iVar6 + 1 < iVar5) {
          pNVar2 = this->impl->details;
          QVar7 = QPDFObjectHandle::getArrayItem(&local_d8,(int)local_48);
          bVar4 = (**(code **)(*(long *)pNVar2 + 8))
                            (pNVar2,&local_d8,
                             QVar7.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
          QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
          if (((bVar4 ^ 0xff) & 1) == 0) {
            items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._3_1_ = 1;
          }
          else {
            QTC::TC("qpdf","NNTree skip invalid key",0);
            pQVar1 = this->impl->qpdf;
            std::__cxx11::to_string(&local_138,this->item_number);
            std::operator+(&local_118,"item ",&local_138);
            std::operator+(&local_f8,&local_118," has the wrong type");
            warn(pQVar1,&this->node,&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_138);
          }
        }
        else {
          QTC::TC("qpdf","NNTree skip item at end of short items",0);
          pQVar1 = this->impl->qpdf;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"items array doesn\'t have enough elements",&local_c1);
          warn(pQVar1,&this->node,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
        }
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
    }
  }
  return;
}

Assistant:

void
NNTreeIterator::increment(bool backward)
{
    if (this->item_number < 0) {
        QTC::TC("qpdf", "NNTree increment end()");
        deepen(impl.oh, !backward, true);
        return;
    }
    bool found_valid_key = false;
    while (valid() && (!found_valid_key)) {
        this->item_number += backward ? -2 : 2;
        auto items = this->node.getKey(impl.details.itemsKey());
        if ((this->item_number < 0) || (this->item_number >= items.getArrayNItems())) {
            bool found = false;
            setItemNumber(QPDFObjectHandle(), -1);
            while (!(found || this->path.empty())) {
                auto& element = this->path.back();
                auto pe_node = getNextKid(element, backward);
                if (pe_node.isNull()) {
                    this->path.pop_back();
                } else {
                    found = deepen(pe_node, !backward, false);
                }
            }
        }
        if (this->item_number >= 0) {
            items = this->node.getKey(impl.details.itemsKey());
            if (this->item_number + 1 >= items.getArrayNItems()) {
                QTC::TC("qpdf", "NNTree skip item at end of short items");
                warn(impl.qpdf, this->node, "items array doesn't have enough elements");
            } else if (!impl.details.keyValid(items.getArrayItem(this->item_number))) {
                QTC::TC("qpdf", "NNTree skip invalid key");
                warn(
                    impl.qpdf,
                    this->node,
                    ("item " + std::to_string(this->item_number) + " has the wrong type"));
            } else {
                found_valid_key = true;
            }
        }
    }
}